

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkReverseTopoOrder(Abc_Ntk_t *p)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  uint uVar6;
  size_t __size;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  if (p->vTopo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTopo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xa6b,"void Abc_NtkReverseTopoOrder(Abc_Ntk_t *)");
  }
  iVar1 = p->vObjs->nSize;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 * 10 - 1U) {
    iVar5 = iVar1 * 10;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar5;
  if (iVar5 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar2->pArray = piVar3;
  p->vTopo = pVVar2;
  uVar8 = (long)iVar1 * 2;
  iVar7 = (int)uVar8;
  if (iVar5 < iVar7) {
    __size = (long)iVar1 << 3;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(__size);
    }
    else {
      piVar3 = (int *)realloc(piVar3,__size);
    }
    pVVar2->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
LAB_00870248:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar2->nCap = iVar7;
  }
  if (0 < iVar1) {
    memset(pVVar2->pArray,0,(uVar8 & 0xffffffff) << 2);
  }
  pVVar2->nSize = iVar7;
  pVVar4 = p->vObjs;
  uVar8 = (ulong)(uint)pVVar4->nSize;
  if (0 < pVVar4->nSize) {
    lVar9 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar4->pArray[lVar9];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        uVar6 = pObj->Id * 2;
        if (((int)uVar6 < 0) || (pVVar2 = pObj->pNtk->vTopo, pVVar2->nSize <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pVVar2->pArray[uVar6] == 0) {
          if ((p->vTravIds).pArray == (int *)0x0) {
            uVar6 = (int)uVar8 + 500;
            if ((p->vTravIds).nCap < (int)uVar6) {
              piVar3 = (int *)malloc((long)(int)uVar6 << 2);
              (p->vTravIds).pArray = piVar3;
              if (piVar3 == (int *)0x0) goto LAB_00870248;
              (p->vTravIds).nCap = uVar6;
            }
            if (-500 < (int)uVar8) {
              memset((p->vTravIds).pArray,0,(ulong)uVar6 << 2);
            }
            (p->vTravIds).nSize = uVar6;
          }
          iVar1 = p->nTravIds;
          p->nTravIds = iVar1 + 1;
          if (0x3ffffffe < iVar1) {
            __assert_fail("p->nTravIds < (1<<30)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
          }
          Abc_NtkReverseTopoOrder_rec(pObj,1);
        }
      }
      lVar9 = lVar9 + 1;
      pVVar4 = p->vObjs;
      uVar8 = (ulong)pVVar4->nSize;
    } while (lVar9 < (long)uVar8);
  }
  printf("Nodes = %d.   Size = %d.  Ratio = %f.\n",
         (double)p->vTopo->nSize / (double)p->nObjCounts[7]);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrder( Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    assert( p->vTopo == NULL );
    p->vTopo = Vec_IntAlloc( 10 * Abc_NtkObjNumMax(p) );
    Vec_IntFill( p->vTopo, 2 * Abc_NtkObjNumMax(p), 0 );
    Abc_NtkForEachNode( p, pObj, i )
    {
        if ( Abc_NtkTopoHasBeg(pObj) )
            continue;
        Abc_NtkIncrementTravId( p );        
        Abc_NtkReverseTopoOrder_rec( pObj, 1 );
    }
    printf( "Nodes = %d.   Size = %d.  Ratio = %f.\n", 
        Abc_NtkNodeNum(p), Vec_IntSize(p->vTopo), 1.0*Vec_IntSize(p->vTopo)/Abc_NtkNodeNum(p) );
}